

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_compress_fast_extState_fastReset
              (void *state,char *src,char *dst,int srcSize,int dstCapacity,int acceleration)

{
  ulong *puVar1;
  short sVar2;
  short sVar3;
  char cVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  long *plVar8;
  int *piVar9;
  int iVar10;
  long *plVar11;
  long *plVar12;
  int *piVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  int *piVar17;
  ulong *puVar18;
  ushort uVar19;
  uint uVar20;
  ulong *puVar21;
  int *piVar22;
  int iVar23;
  char cVar24;
  int iVar25;
  char *pcVar26;
  short *psVar27;
  long *plVar28;
  char *pcVar29;
  long lVar30;
  short *psVar31;
  char *pcVar32;
  short *psVar33;
  BYTE *e_1;
  BYTE *s;
  ulong *puVar34;
  long lVar35;
  BYTE *e_3;
  long lVar36;
  int *piVar37;
  BYTE *s_2;
  long *plVar38;
  U16 *hashTable;
  short *local_a8;
  short *local_88;
  int local_68;
  
  if (acceleration < 2) {
    acceleration = 1;
  }
  iVar10 = 0;
  if ((uint)srcSize < 0x7e000001) {
    iVar10 = srcSize + (uint)srcSize / 0xff + 0x10;
  }
  sVar2 = *(short *)((long)state + 0x4004);
  sVar3 = (short)src;
  local_68 = (int)dst;
  if (iVar10 <= dstCapacity) {
    if (0x1000a < srcSize) {
      if (sVar2 == 0) {
        if (*(short *)((long)state + 0x4006) == 0) {
          if (*(int *)((long)state + 0x4000) == 0) {
            uVar5 = 0;
          }
          else {
            uVar5 = *(int *)((long)state + 0x4000) + 0x10000;
            *(uint *)((long)state + 0x4000) = uVar5;
          }
        }
        else {
          *(undefined2 *)((long)state + 0x4006) = 0;
          uVar5 = 0;
          memset(state,0,0x4004);
        }
        *(undefined8 *)((long)state + 0x4008) = 0;
        *(undefined8 *)((long)state + 0x4010) = 0;
        *(undefined4 *)((long)state + 0x4018) = 0;
      }
      else {
        uVar5 = 0;
        memset(state,0,0x4020);
      }
      if (0x7e000000 < (uint)srcSize) {
        return 0;
      }
      lVar36 = (long)src - (ulong)uVar5;
      plVar8 = (long *)(src + ((ulong)(uint)srcSize - 0xb));
      *(int *)((long)state + 0x4018) = srcSize;
      *(uint *)((long)state + 0x4000) = srcSize + uVar5;
      *(undefined2 *)((long)state + 0x4006) = 2;
      *(uint *)((long)state + ((ulong)(*(long *)src * -0x30e4432345000000) >> 0x34) * 4) = uVar5;
      plVar11 = (long *)(src + 2);
      plVar38 = (long *)src;
LAB_001048ed:
      lVar35 = *(long *)((long)plVar38 + 1);
      plVar28 = (long *)((long)plVar38 + 1);
      iVar10 = acceleration << 6;
      while( true ) {
        uVar7 = (ulong)(lVar35 * -0x30e4432345000000) >> 0x34;
        uVar5 = *(uint *)((long)state + uVar7 * 4);
        iVar23 = (int)lVar36;
        uVar15 = (int)plVar28 - iVar23;
        lVar35 = *plVar11;
        *(uint *)((long)state + uVar7 * 4) = uVar15;
        if ((uVar15 <= uVar5 + 0xffff) && (*(int *)(lVar36 + (ulong)uVar5) == (int)*plVar28)) break;
        plVar12 = (long *)((long)(iVar10 >> 6) + (long)plVar11);
        iVar10 = iVar10 + 1;
        plVar28 = plVar11;
        plVar11 = plVar12;
        if (plVar8 < plVar12) goto LAB_00104c62;
      }
      lVar14 = (ulong)uVar5 + lVar36;
      iVar10 = (int)plVar28 - (int)plVar38;
      lVar35 = 0;
      cVar4 = (char)plVar28 * '\x10' + (char)plVar38 * -0x10;
      uVar5 = iVar10 - 0xfU;
      do {
        uVar15 = uVar5;
        cVar24 = cVar4;
        lVar30 = lVar35;
        piVar37 = (int *)(lVar14 + lVar30);
        plVar11 = (long *)((long)plVar28 + lVar30);
        if ((piVar37 <= src) || (plVar11 <= plVar38)) break;
        lVar35 = lVar30 + -1;
        cVar4 = cVar24 + -0x10;
        uVar5 = uVar15 - 1;
      } while (*(char *)((long)plVar28 + lVar30 + -1) == *(char *)(lVar14 + -1 + lVar30));
      iVar25 = (int)lVar30;
      plVar28 = (long *)(dst + 1);
      if ((uint)(iVar10 + iVar25) < 0xf) {
        *dst = cVar24;
      }
      else {
        uVar7 = (ulong)(iVar10 - 0xfU) + lVar30;
        *dst = -0x10;
        if (0xfe < (int)uVar7) {
          uVar5 = 0x1fd;
          if (uVar15 < 0x1fd) {
            uVar5 = uVar15;
          }
          if (0x1fc < (int)uVar15) {
            uVar15 = 0x1fd;
          }
          memset(plVar28,0xff,(ulong)((((iVar10 + 0xef) - uVar5) + iVar25) / 0xff + 1));
          uVar5 = ((iVar10 + 0xef) - uVar15) + iVar25;
          plVar28 = (long *)(dst + (ulong)uVar5 / 0xff + 2);
          uVar7 = (ulong)(iVar10 + -0x10e + iVar25 + (uVar5 % 0xff - uVar5));
        }
        *(char *)plVar28 = (char)uVar7;
        plVar28 = (long *)((long)plVar28 + 1);
      }
      plVar12 = (long *)((ulong)(uint)((int)plVar11 - (int)plVar38) + (long)plVar28);
      do {
        *plVar28 = *plVar38;
        plVar28 = plVar28 + 1;
        plVar38 = plVar38 + 1;
      } while (plVar28 < plVar12);
      do {
        *(short *)plVar12 = (short)plVar11 - (short)piVar37;
        pcVar32 = (char *)((long)plVar12 + 2);
        puVar1 = (ulong *)((long)plVar11 + 4);
        puVar18 = (ulong *)(piVar37 + 1);
        puVar21 = puVar1;
        if (puVar1 < src + ((ulong)(uint)srcSize - 0xc)) {
          if (*puVar18 == *puVar1) {
            puVar18 = (ulong *)(piVar37 + 3);
            puVar21 = (ulong *)((long)plVar11 + 0xc);
            goto LAB_00104aca;
          }
          uVar6 = *puVar1 ^ *puVar18;
          uVar7 = 0;
          if (uVar6 != 0) {
            for (; (uVar6 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
            }
          }
          uVar7 = uVar7 >> 3 & 0x1fffffff;
          plVar38 = (long *)((long)plVar11 + uVar7 + 4);
LAB_00104b93:
          *dst = *dst + (char)uVar7;
          dst = pcVar32;
        }
        else {
LAB_00104aca:
          if (puVar21 < src + ((ulong)(uint)srcSize - 0xc)) {
            if (*puVar18 == *puVar21) goto code_r0x00104ade;
            uVar6 = *puVar21 ^ *puVar18;
            uVar7 = 0;
            if (uVar6 != 0) {
              for (; (uVar6 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
              }
            }
            puVar21 = (ulong *)((long)puVar21 + (uVar7 >> 3 & 0x1fffffff));
          }
          else {
            if ((puVar21 < src + ((ulong)(uint)srcSize - 8)) && ((int)*puVar18 == (int)*puVar21)) {
              puVar21 = (ulong *)((long)puVar21 + 4);
              puVar18 = (ulong *)((long)puVar18 + 4);
            }
            if ((puVar21 < src + ((ulong)(uint)srcSize - 6)) && ((short)*puVar18 == (short)*puVar21)
               ) {
              puVar21 = (ulong *)((long)puVar21 + 2);
              puVar18 = (ulong *)((long)puVar18 + 2);
            }
            if (puVar21 < src + ((ulong)(uint)srcSize - 5)) {
              puVar21 = (ulong *)((long)puVar21 + (ulong)((char)*puVar18 == (char)*puVar21));
            }
          }
          uVar7 = (long)puVar21 - (long)puVar1;
          uVar5 = (uint)uVar7;
          plVar38 = (long *)((long)plVar11 + (uVar7 & 0xffffffff) + 4);
          if (uVar5 < 0xf) goto LAB_00104b93;
          *dst = *dst + '\x0f';
          uVar15 = uVar5 - 0xf;
          pcVar32[0] = -1;
          pcVar32[1] = -1;
          pcVar32[2] = -1;
          pcVar32[3] = -1;
          if (0x3fb < uVar15) {
            uVar15 = (uVar5 - 0x40b) % 0x3fc;
            uVar7 = (ulong)((uVar5 - 0x40b) / 0x3fc << 2);
            memset((char *)((long)plVar12 + 6),0xff,uVar7 + 4);
            pcVar32 = (char *)(uVar7 + 6 + (long)plVar12);
          }
          pcVar32[(ushort)((uVar15 & 0xffff) / 0xff)] = (char)((uVar15 & 0xffff) % 0xff);
          dst = pcVar32 + (ushort)((uVar15 & 0xffff) / 0xff) + 1;
        }
        if (plVar8 <= plVar38) goto LAB_00104c62;
        *(int *)((long)state +
                ((ulong)(*(long *)((long)plVar38 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
             ((int)plVar38 + -2) - iVar23;
        uVar7 = (ulong)(*plVar38 * -0x30e4432345000000) >> 0x34;
        uVar15 = (int)plVar38 - iVar23;
        uVar5 = *(uint *)((long)state + uVar7 * 4);
        *(uint *)((long)state + uVar7 * 4) = uVar15;
        if ((uVar5 + 0xffff < uVar15) ||
           (piVar37 = (int *)((ulong)uVar5 + lVar36), *piVar37 != (int)*plVar38)) goto LAB_00104c4a;
        plVar12 = (long *)(dst + 1);
        *dst = '\0';
        plVar11 = plVar38;
      } while( true );
    }
    if (sVar2 == 0) {
      if (*(short *)((long)state + 0x4006) == 3) {
        uVar5 = *(uint *)((long)state + 0x4000);
        if (0xfff < srcSize || 0xfffe < uVar5 + srcSize) goto LAB_00103e7f;
      }
      else {
        if (*(short *)((long)state + 0x4006) != 0) {
LAB_00103e7f:
          memset(state,0,0x4004);
          *(undefined8 *)((long)state + 0x4006) = 0;
          *(undefined8 *)((long)state + 0x400e) = 0;
          *(undefined8 *)((long)state + 0x4014) = 0;
          goto LAB_00103f0a;
        }
        uVar5 = *(uint *)((long)state + 0x4000);
      }
      *(undefined4 *)((long)state + 0x4018) = 0;
      *(undefined8 *)((long)state + 0x4008) = 0;
      *(undefined8 *)((long)state + 0x4010) = 0;
      if (uVar5 != 0) {
        if (0x7e000000 < (uint)srcSize) {
          return 0;
        }
        *(int *)((long)state + 0x4018) = srcSize;
        *(uint *)((long)state + 0x4000) = uVar5 + srcSize;
        *(undefined2 *)((long)state + 0x4006) = 3;
        piVar37 = (int *)src;
        if (0xc < (uint)srcSize) {
          lVar36 = (long)src - (ulong)uVar5;
          piVar22 = (int *)(src + (long)srcSize + -0xb);
          *(short *)((long)state + (ulong)((uint)(*(int *)src * -0x61c8864f) >> 0x13) * 2) =
               (short)uVar5;
          piVar17 = (int *)(src + 2);
LAB_00105275:
          iVar10 = *(int *)((long)piVar37 + 1);
          piVar9 = (int *)((long)piVar37 + 1);
          iVar23 = acceleration << 6;
          while( true ) {
            uVar7 = (ulong)((uint)(iVar10 * -0x61c8864f) >> 0x13);
            uVar19 = *(ushort *)((long)state + uVar7 * 2);
            sVar2 = (short)lVar36;
            iVar10 = *piVar17;
            *(short *)((long)state + uVar7 * 2) = (short)piVar9 - sVar2;
            if ((uVar5 <= uVar19) && (*(int *)(lVar36 + (ulong)uVar19) == *piVar9)) break;
            piVar13 = (int *)((long)(iVar23 >> 6) + (long)piVar17);
            iVar23 = iVar23 + 1;
            piVar9 = piVar17;
            piVar17 = piVar13;
            if (piVar22 < piVar13) goto LAB_001055e2;
          }
          lVar14 = (ulong)uVar19 + lVar36;
          iVar10 = (int)piVar9 - (int)piVar37;
          lVar35 = 0;
          cVar4 = (char)piVar9 * '\x10' + (char)piVar37 * -0x10;
          uVar15 = iVar10 - 0xfU;
          do {
            uVar16 = uVar15;
            cVar24 = cVar4;
            lVar30 = lVar35;
            piVar17 = (int *)(lVar14 + lVar30);
            piVar13 = (int *)((long)piVar9 + lVar30);
            if ((piVar17 <= src) || (piVar13 <= piVar37)) break;
            lVar35 = lVar30 + -1;
            cVar4 = cVar24 + -0x10;
            uVar15 = uVar16 - 1;
          } while (*(char *)((long)piVar9 + lVar30 + -1) == *(char *)(lVar14 + -1 + lVar30));
          iVar23 = (int)lVar30;
          psVar27 = (short *)((long)dst + 1);
          if ((uint)(iVar10 + iVar23) < 0xf) {
            *dst = cVar24;
          }
          else {
            uVar7 = (ulong)(iVar10 - 0xfU) + lVar30;
            *dst = -0x10;
            if (0xfe < (int)uVar7) {
              uVar15 = 0x1fd;
              if (uVar16 < 0x1fd) {
                uVar15 = uVar16;
              }
              if (0x1fc < (int)uVar16) {
                uVar16 = 0x1fd;
              }
              memset(psVar27,0xff,(ulong)((((iVar10 + 0xef) - uVar15) + iVar23) / 0xff + 1));
              uVar15 = ((iVar10 + 0xef) - uVar16) + iVar23;
              psVar27 = (short *)((long)dst + (ulong)uVar15 / 0xff + 2);
              uVar7 = (ulong)(iVar10 + -0x10e + iVar23 + (uVar15 % 0xff - uVar15));
            }
            *(char *)psVar27 = (char)uVar7;
            psVar27 = (short *)((long)psVar27 + 1);
          }
          psVar31 = (short *)((ulong)(uint)((int)piVar13 - (int)piVar37) + (long)psVar27);
          do {
            *(undefined8 *)psVar27 = *(undefined8 *)piVar37;
            psVar27 = psVar27 + 4;
            piVar37 = piVar37 + 2;
          } while (psVar27 < psVar31);
          do {
            *psVar31 = (short)piVar13 - (short)piVar17;
            psVar27 = psVar31 + 1;
            puVar1 = (ulong *)(piVar13 + 1);
            puVar18 = (ulong *)(piVar17 + 1);
            puVar21 = puVar1;
            if (puVar1 < src + (long)srcSize + -0xc) {
              if (*puVar18 == *puVar1) {
                puVar18 = (ulong *)(piVar17 + 3);
                puVar21 = (ulong *)(piVar13 + 3);
                goto LAB_00105451;
              }
              uVar6 = *puVar1 ^ *puVar18;
              uVar7 = 0;
              if (uVar6 != 0) {
                for (; (uVar6 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                }
              }
              uVar7 = uVar7 >> 3 & 0x1fffffff;
              piVar37 = (int *)((long)piVar13 + uVar7 + 4);
LAB_00105515:
              *dst = (char)*(short *)dst + (char)uVar7;
              dst = (char *)psVar27;
            }
            else {
LAB_00105451:
              if (puVar21 < src + (long)srcSize + -0xc) {
                if (*puVar18 == *puVar21) goto code_r0x00105465;
                uVar6 = *puVar21 ^ *puVar18;
                uVar7 = 0;
                if (uVar6 != 0) {
                  for (; (uVar6 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                  }
                }
                puVar21 = (ulong *)((long)puVar21 + (uVar7 >> 3 & 0x1fffffff));
              }
              else {
                if ((puVar21 < src + (long)srcSize + -8) && ((int)*puVar18 == (int)*puVar21)) {
                  puVar21 = (ulong *)((long)puVar21 + 4);
                  puVar18 = (ulong *)((long)puVar18 + 4);
                }
                if ((puVar21 < src + (long)srcSize + -6) && ((short)*puVar18 == (short)*puVar21)) {
                  puVar21 = (ulong *)((long)puVar21 + 2);
                  puVar18 = (ulong *)((long)puVar18 + 2);
                }
                if (puVar21 < src + (long)srcSize + -5) {
                  puVar21 = (ulong *)((long)puVar21 + (ulong)((char)*puVar18 == (char)*puVar21));
                }
              }
              uVar7 = (long)puVar21 - (long)puVar1;
              uVar15 = (uint)uVar7;
              piVar37 = (int *)((long)piVar13 + (uVar7 & 0xffffffff) + 4);
              if (uVar15 < 0xf) goto LAB_00105515;
              *dst = (char)*(short *)dst + '\x0f';
              uVar16 = uVar15 - 0xf;
              psVar27[0] = -1;
              psVar27[1] = -1;
              if (0x3fb < uVar16) {
                uVar16 = (uVar15 - 0x40b) % 0x3fc;
                uVar7 = (ulong)((uVar15 - 0x40b) / 0x3fc << 2);
                memset(psVar31 + 3,0xff,uVar7 + 4);
                psVar27 = (short *)(uVar7 + 6 + (long)psVar31);
              }
              pcVar32 = (char *)((long)psVar27 + (ulong)(ushort)((uVar16 & 0xffff) / 0xff));
              *pcVar32 = (char)((uVar16 & 0xffff) % 0xff);
              dst = pcVar32 + 1;
            }
            if (piVar22 <= piVar37) break;
            *(short *)((long)state +
                      (ulong)((uint)(*(int *)((long)piVar37 + -2) * -0x61c8864f) >> 0x13) * 2) =
                 ((short)piVar37 + -2) - sVar2;
            uVar7 = (ulong)((uint)(*piVar37 * -0x61c8864f) >> 0x13);
            uVar19 = *(ushort *)((long)state + uVar7 * 2);
            *(short *)((long)state + uVar7 * 2) = (short)piVar37 - sVar2;
            if ((uVar19 < uVar5) ||
               (piVar17 = (int *)((ulong)uVar19 + lVar36), *piVar17 != *piVar37)) goto LAB_001055c8;
            psVar31 = (short *)((long)dst + 1);
            *dst = '\0';
            piVar13 = piVar37;
          } while( true );
        }
LAB_001055e2:
        pcVar32 = src + ((long)srcSize - (long)piVar37);
        if (pcVar32 < (char *)0xf) {
          *dst = (char)pcVar32 << 4;
        }
        else {
          pcVar26 = pcVar32 + -0xf;
          *dst = -0x10;
          psVar27 = (short *)((long)dst + 1);
          if ((char *)0xfe < pcVar26) {
            uVar7 = (ulong)(pcVar32 + -0x10e) / 0xff;
            memset(psVar27,0xff,uVar7 + 1);
            pcVar26 = pcVar32 + uVar7 * -0xff + -0x10e;
            psVar27 = (short *)((long)dst + uVar7 + 2);
          }
          *(char *)psVar27 = (char)pcVar26;
          dst = (char *)psVar27;
        }
        memcpy((char *)((long)dst + 1),piVar37,(size_t)pcVar32);
        iVar10 = (int)(char *)((long)dst + 1) + (int)pcVar32;
        goto LAB_00104ce4;
      }
    }
    else {
      memset(state,0,0x4020);
    }
LAB_00103f0a:
    if (0x7e000000 < (uint)srcSize) {
      return 0;
    }
    *(int *)((long)state + 0x4018) = srcSize;
    *(int *)((long)state + 0x4000) = srcSize;
    *(undefined2 *)((long)state + 0x4006) = 3;
    local_a8 = (short *)dst;
    piVar37 = (int *)src;
    if (0xc < (uint)srcSize) {
      *(undefined2 *)((long)state + (ulong)((uint)(*(int *)src * -0x61c8864f) >> 0x13) * 2) = 0;
LAB_00103faa:
      iVar25 = 1;
      iVar10 = *(int *)((long)piVar37 + 1);
      piVar17 = (int *)((long)piVar37 + 1);
      iVar23 = acceleration << 6;
      do {
        piVar22 = piVar17;
        piVar17 = (int *)((long)iVar25 + (long)piVar22);
        if (src + (long)srcSize + -0xb < piVar17) goto LAB_001042f9;
        iVar25 = iVar23 >> 6;
        iVar23 = iVar23 + 1;
        uVar6 = (ulong)((uint)(iVar10 * -0x61c8864f) >> 0x13);
        uVar7 = (ulong)*(ushort *)((long)state + uVar6 * 2);
        iVar10 = *piVar17;
        *(short *)((long)state + uVar6 * 2) = (short)piVar22 - sVar3;
      } while (*(int *)(src + uVar7) != *piVar22);
      iVar10 = (int)piVar22 - (int)piVar37;
      lVar36 = 0;
      cVar4 = (char)piVar22 * '\x10' + (char)piVar37 * -0x10;
      uVar5 = iVar10 - 0xfU;
      do {
        uVar15 = uVar5;
        cVar24 = cVar4;
        lVar35 = lVar36;
        pcVar32 = src + lVar35 + uVar7;
        piVar17 = (int *)((long)piVar22 + lVar35);
        if ((pcVar32 <= src) || (piVar17 <= piVar37)) break;
        lVar36 = lVar35 + -1;
        cVar4 = cVar24 + -0x10;
        uVar5 = uVar15 - 1;
      } while (*(char *)((long)piVar22 + lVar35 + -1) == src[lVar35 + (uVar7 - 1)]);
      iVar23 = (int)lVar35;
      psVar27 = (short *)((long)local_a8 + 1);
      if ((uint)(iVar10 + iVar23) < 0xf) {
        *(char *)local_a8 = cVar24;
      }
      else {
        uVar7 = (ulong)(iVar10 - 0xfU) + lVar35;
        *(char *)local_a8 = -0x10;
        if (0xfe < (int)uVar7) {
          uVar5 = 0x1fd;
          if (uVar15 < 0x1fd) {
            uVar5 = uVar15;
          }
          if (0x1fc < (int)uVar15) {
            uVar15 = 0x1fd;
          }
          memset(psVar27,0xff,(ulong)((((iVar10 + 0xef) - uVar5) + iVar23) / 0xff + 1));
          uVar5 = ((iVar10 + 0xef) - uVar15) + iVar23;
          psVar27 = (short *)((long)local_a8 + (ulong)uVar5 / 0xff + 2);
          uVar7 = (ulong)(iVar10 + -0x10e + iVar23 + (uVar5 % 0xff - uVar5));
        }
        *(char *)psVar27 = (char)uVar7;
        psVar27 = (short *)((long)psVar27 + 1);
      }
      psVar31 = (short *)((ulong)(uint)((int)piVar17 - (int)piVar37) + (long)psVar27);
      do {
        *(undefined8 *)psVar27 = *(undefined8 *)piVar37;
        psVar27 = psVar27 + 4;
        piVar37 = piVar37 + 2;
        psVar33 = local_a8;
      } while (psVar27 < psVar31);
      do {
        *psVar31 = (short)piVar17 - (short)pcVar32;
        local_a8 = psVar31 + 1;
        puVar1 = (ulong *)(piVar17 + 1);
        puVar18 = (ulong *)(pcVar32 + 4);
        puVar21 = puVar1;
        if (puVar1 < src + (long)srcSize + -0xc) {
          if (*puVar18 == *puVar1) {
            puVar18 = (ulong *)(pcVar32 + 0xc);
            puVar21 = (ulong *)(piVar17 + 3);
            goto LAB_00104171;
          }
          uVar6 = *puVar1 ^ *puVar18;
          uVar7 = 0;
          if (uVar6 != 0) {
            for (; (uVar6 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
            }
          }
          uVar7 = uVar7 >> 3 & 0x1fffffff;
          piVar37 = (int *)((long)piVar17 + uVar7 + 4);
LAB_00104226:
          *(char *)psVar33 = (char)*psVar33 + (char)uVar7;
        }
        else {
LAB_00104171:
          if (puVar21 < src + (long)srcSize + -0xc) {
            if (*puVar18 == *puVar21) goto code_r0x00104185;
            uVar6 = *puVar21 ^ *puVar18;
            uVar7 = 0;
            if (uVar6 != 0) {
              for (; (uVar6 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
              }
            }
            puVar21 = (ulong *)((long)puVar21 + (uVar7 >> 3 & 0x1fffffff));
          }
          else {
            if ((puVar21 < src + (long)srcSize + -8) && ((int)*puVar18 == (int)*puVar21)) {
              puVar21 = (ulong *)((long)puVar21 + 4);
              puVar18 = (ulong *)((long)puVar18 + 4);
            }
            if ((puVar21 < src + (long)srcSize + -6) && ((short)*puVar18 == (short)*puVar21)) {
              puVar21 = (ulong *)((long)puVar21 + 2);
              puVar18 = (ulong *)((long)puVar18 + 2);
            }
            if (puVar21 < src + (long)srcSize + -5) {
              puVar21 = (ulong *)((long)puVar21 + (ulong)((char)*puVar18 == (char)*puVar21));
            }
          }
          uVar7 = (long)puVar21 - (long)puVar1;
          uVar5 = (uint)uVar7;
          piVar37 = (int *)((long)piVar17 + (uVar7 & 0xffffffff) + 4);
          if (uVar5 < 0xf) goto LAB_00104226;
          *(char *)psVar33 = (char)*psVar33 + '\x0f';
          uVar15 = uVar5 - 0xf;
          local_a8[0] = -1;
          local_a8[1] = -1;
          if (0x3fb < uVar15) {
            uVar15 = (uVar5 - 0x40b) % 0x3fc;
            uVar7 = (ulong)((uVar5 - 0x40b) / 0x3fc << 2);
            memset(psVar31 + 3,0xff,uVar7 + 4);
            local_a8 = (short *)((long)psVar31 + uVar7 + 6);
          }
          pcVar32 = (char *)((long)local_a8 + (ulong)(ushort)((uVar15 & 0xffff) / 0xff));
          local_a8 = (short *)(pcVar32 + 1);
          *pcVar32 = (char)((uVar15 & 0xffff) % 0xff);
        }
        if (src + (long)srcSize + -0xb <= piVar37) break;
        *(short *)((long)state +
                  (ulong)((uint)(*(int *)((long)piVar37 + -2) * -0x61c8864f) >> 0x13) * 2) =
             ((short)piVar37 + -2) - sVar3;
        uVar7 = (ulong)((uint)(*piVar37 * -0x61c8864f) >> 0x13);
        uVar19 = *(ushort *)((long)state + uVar7 * 2);
        pcVar32 = src + uVar19;
        *(short *)((long)state + uVar7 * 2) = (short)piVar37 - sVar3;
        if (*(int *)(src + uVar19) != *piVar37) goto LAB_00103faa;
        psVar31 = (short *)((long)local_a8 + 1);
        *(char *)local_a8 = '\0';
        psVar33 = local_a8;
        piVar17 = piVar37;
      } while( true );
    }
LAB_001042f9:
    pcVar32 = src + ((long)srcSize - (long)piVar37);
    if (pcVar32 < (char *)0xf) {
      *(char *)local_a8 = (char)pcVar32 << 4;
    }
    else {
      pcVar26 = pcVar32 + -0xf;
      *(char *)local_a8 = -0x10;
      psVar27 = (short *)((long)local_a8 + 1);
      if ((char *)0xfe < pcVar26) {
        uVar7 = (ulong)(pcVar32 + -0x10e) / 0xff;
        memset((short *)((long)local_a8 + 1),0xff,uVar7 + 1);
        pcVar26 = pcVar32 + uVar7 * -0xff + -0x10e;
        psVar27 = (short *)((long)local_a8 + uVar7 + 2);
      }
      local_a8 = psVar27;
      *(char *)local_a8 = (char)pcVar26;
    }
    memcpy((char *)((long)local_a8 + 1),piVar37,(size_t)pcVar32);
    iVar10 = (int)(char *)((long)local_a8 + 1) + (int)pcVar32;
LAB_00104ce4:
    return iVar10 - local_68;
  }
  if (0x1000a < srcSize) {
    if (sVar2 == 0) {
      if (*(short *)((long)state + 0x4006) == 0) {
        if (*(int *)((long)state + 0x4000) == 0) {
          uVar5 = 0;
        }
        else {
          uVar5 = *(int *)((long)state + 0x4000) + 0x10000;
          *(uint *)((long)state + 0x4000) = uVar5;
        }
      }
      else {
        *(undefined2 *)((long)state + 0x4006) = 0;
        uVar5 = 0;
        memset(state,0,0x4004);
      }
      *(undefined8 *)((long)state + 0x4008) = 0;
      *(undefined8 *)((long)state + 0x4010) = 0;
      *(undefined4 *)((long)state + 0x4018) = 0;
    }
    else {
      uVar5 = 0;
      memset(state,0,0x4020);
    }
    if (0x7e000000 < (uint)srcSize) {
      return 0;
    }
    lVar36 = (long)src - (ulong)uVar5;
    pcVar32 = dst + dstCapacity;
    plVar8 = (long *)(src + ((ulong)(uint)srcSize - 0xb));
    *(int *)((long)state + 0x4018) = srcSize;
    *(uint *)((long)state + 0x4000) = srcSize + uVar5;
    *(undefined2 *)((long)state + 0x4006) = 2;
    *(uint *)((long)state + ((ulong)(*(long *)src * -0x30e4432345000000) >> 0x34) * 4) = uVar5;
    plVar11 = (long *)(src + 2);
    puVar1 = (ulong *)(src + ((ulong)(uint)srcSize - 0xc));
    plVar38 = (long *)src;
LAB_00104463:
    lVar35 = *(long *)((long)plVar38 + 1);
    plVar28 = (long *)((long)plVar38 + 1);
    iVar10 = acceleration << 6;
    while( true ) {
      uVar7 = (ulong)(lVar35 * -0x30e4432345000000) >> 0x34;
      uVar5 = *(uint *)((long)state + uVar7 * 4);
      iVar23 = (int)plVar28;
      iVar25 = (int)lVar36;
      lVar35 = *plVar11;
      *(int *)((long)state + uVar7 * 4) = iVar23 - iVar25;
      if (((uint)(iVar23 - iVar25) <= uVar5 + 0xffff) &&
         (*(int *)(lVar36 + (ulong)uVar5) == (int)*plVar28)) break;
      plVar12 = (long *)((long)(iVar10 >> 6) + (long)plVar11);
      iVar10 = iVar10 + 1;
      plVar28 = plVar11;
      plVar11 = plVar12;
      if (plVar8 < plVar12) goto LAB_00104cf6;
    }
    lVar14 = (ulong)uVar5 + lVar36;
    uVar15 = iVar23 - (int)plVar38;
    lVar35 = 0;
    uVar5 = uVar15 - 0xf;
    cVar4 = (char)plVar28 * '\x10' + (char)plVar38 * -0x10;
    do {
      cVar24 = cVar4;
      uVar16 = uVar5;
      lVar30 = lVar35;
      piVar37 = (int *)(lVar14 + lVar30);
      plVar11 = (long *)((long)plVar28 + lVar30);
      if ((piVar37 <= src) || (plVar11 <= plVar38)) break;
      lVar35 = lVar30 + -1;
      uVar5 = uVar16 - 1;
      cVar4 = cVar24 + -0x10;
    } while (*(char *)((long)plVar28 + lVar30 + -1) == *(char *)(lVar14 + -1 + lVar30));
    iVar10 = (int)lVar30;
    uVar7 = (ulong)(uint)(iVar10 + (iVar23 - (int)plVar38));
    if (pcVar32 < dst + ((ulong)uVar15 + lVar30 & 0xffffffff) / 0xff + uVar7 + 9) {
      return 0;
    }
    plVar28 = (long *)(dst + 1);
    if ((uint)((ulong)uVar15 + lVar30) < 0xf) {
      *dst = cVar24;
    }
    else {
      uVar6 = (ulong)(uVar15 - 0xf) + lVar30;
      *dst = -0x10;
      if (0xfe < (int)uVar6) {
        uVar5 = 0x1fd;
        if (uVar16 < 0x1fd) {
          uVar5 = uVar16;
        }
        if (0x1fc < (int)uVar16) {
          uVar16 = 0x1fd;
        }
        memset(plVar28,0xff,(ulong)((((uVar15 + 0xef) - uVar5) + iVar10) / 0xff + 1));
        uVar5 = ((uVar15 + 0xef) - uVar16) + iVar10;
        plVar28 = (long *)(dst + (ulong)uVar5 / 0xff + 2);
        uVar6 = (ulong)((uVar15 - 0x10e) + iVar10 + (uVar5 % 0xff - uVar5));
      }
      *(char *)plVar28 = (char)uVar6;
      plVar28 = (long *)((long)plVar28 + 1);
    }
    plVar12 = (long *)(uVar7 + (long)plVar28);
    do {
      *plVar28 = *plVar38;
      plVar28 = plVar28 + 1;
      plVar38 = plVar38 + 1;
    } while (plVar28 < plVar12);
    do {
      *(short *)plVar12 = (short)plVar11 - (short)piVar37;
      puVar18 = (ulong *)((long)plVar11 + 4);
      puVar21 = (ulong *)(piVar37 + 1);
      puVar34 = puVar18;
      if (puVar18 < puVar1) {
        if (*puVar21 == *puVar18) {
          puVar21 = (ulong *)(piVar37 + 3);
          puVar34 = (ulong *)((long)plVar11 + 0xc);
          goto LAB_0010466c;
        }
        uVar7 = *puVar18 ^ *puVar21;
        lVar35 = 0;
        if (uVar7 != 0) {
          for (; (uVar7 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
          }
        }
        uVar5 = (uint)lVar35 >> 3;
      }
      else {
LAB_0010466c:
        if (puVar34 < puVar1) {
          iVar10 = ((int)puVar34 - (int)plVar11) + -4;
LAB_0010467a:
          if (*puVar21 == *puVar34) goto code_r0x00104686;
          uVar6 = *puVar34 ^ *puVar21;
          uVar7 = 0;
          if (uVar6 != 0) {
            for (; (uVar6 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
            }
          }
          uVar5 = ((uint)(uVar7 >> 3) & 0x1fffffff) + iVar10;
          goto LAB_001046fc;
        }
LAB_00104696:
        if ((puVar34 < src + ((ulong)(uint)srcSize - 8)) && ((int)*puVar21 == (int)*puVar34)) {
          puVar34 = (ulong *)((long)puVar34 + 4);
          puVar21 = (ulong *)((long)puVar21 + 4);
        }
        if ((puVar34 < src + ((ulong)(uint)srcSize - 6)) && ((short)*puVar21 == (short)*puVar34)) {
          puVar34 = (ulong *)((long)puVar34 + 2);
          puVar21 = (ulong *)((long)puVar21 + 2);
        }
        if (puVar34 < src + ((ulong)(uint)srcSize - 5)) {
          puVar34 = (ulong *)((long)puVar34 + (ulong)((char)*puVar21 == (char)*puVar34));
        }
        uVar5 = (int)puVar34 - (int)puVar18;
      }
LAB_001046fc:
      if (pcVar32 < (char *)((long)plVar12 + (ulong)(uVar5 + 0xf0) / 0xff + 8)) {
        return 0;
      }
      pcVar26 = (char *)((long)plVar12 + 2);
      if (uVar5 < 0xf) {
        *dst = *dst + (char)uVar5;
        dst = pcVar26;
      }
      else {
        *dst = *dst + '\x0f';
        uVar19 = (ushort)(uVar5 - 0xf);
        pcVar26[0] = -1;
        pcVar26[1] = -1;
        pcVar26[2] = -1;
        pcVar26[3] = -1;
        if (0x3fb < uVar5 - 0xf) {
          uVar19 = (ushort)((ulong)(uVar5 - 0x40b) % 0x3fc);
          uVar7 = (ulong)((uVar5 - 0x40b) / 0x3fc << 2);
          memset((char *)((long)plVar12 + 6),0xff,uVar7 + 4);
          pcVar26 = (char *)((long)plVar12 + uVar7 + 6);
        }
        pcVar26[uVar19 / 0xff] = (char)((uint)uVar19 % 0xff);
        dst = pcVar26 + uVar19 / 0xff + 1;
      }
      lVar35 = (long)plVar11 + (ulong)uVar5;
      plVar38 = (long *)(lVar35 + 4);
      if (plVar8 <= plVar38) goto LAB_00104cf6;
      *(int *)((long)state + ((ulong)(*(long *)(lVar35 + 2) * -0x30e4432345000000) >> 0x34) * 4) =
           ((int)lVar35 + 2) - iVar25;
      uVar7 = (ulong)(*plVar38 * -0x30e4432345000000) >> 0x34;
      uVar15 = (int)plVar38 - iVar25;
      uVar5 = *(uint *)((long)state + uVar7 * 4);
      *(uint *)((long)state + uVar7 * 4) = uVar15;
      if ((uVar5 + 0xffff < uVar15) ||
         (piVar37 = (int *)((ulong)uVar5 + lVar36), *piVar37 != *(int *)plVar38)) goto LAB_0010481f;
      plVar12 = (long *)(dst + 1);
      *dst = '\0';
      plVar11 = plVar38;
    } while( true );
  }
  if (sVar2 == 0) {
    if (*(short *)((long)state + 0x4006) == 3) {
      uVar5 = *(uint *)((long)state + 0x4000);
      if (0xfff < srcSize || 0xfffe < srcSize + uVar5) goto LAB_001038e4;
    }
    else {
      if (*(short *)((long)state + 0x4006) != 0) {
LAB_001038e4:
        memset(state,0,0x4004);
        *(undefined8 *)((long)state + 0x4006) = 0;
        *(undefined8 *)((long)state + 0x400e) = 0;
        *(undefined8 *)((long)state + 0x4014) = 0;
        goto LAB_00103912;
      }
      uVar5 = *(uint *)((long)state + 0x4000);
    }
    *(undefined4 *)((long)state + 0x4018) = 0;
    *(undefined8 *)((long)state + 0x4008) = 0;
    *(undefined8 *)((long)state + 0x4010) = 0;
    if (uVar5 != 0) {
      if (0x7e000000 < (uint)srcSize) {
        return 0;
      }
      pcVar32 = dst + dstCapacity;
      *(int *)((long)state + 0x4018) = srcSize;
      *(uint *)((long)state + 0x4000) = srcSize + uVar5;
      *(undefined2 *)((long)state + 0x4006) = 3;
      piVar37 = (int *)src;
      if ((uint)srcSize < 0xd) {
LAB_0010566f:
        pcVar26 = src + ((long)srcSize - (long)piVar37);
        if ((char *)((long)dst + (long)(pcVar26 + (ulong)(pcVar26 + 0xf0) / 0xff + 1)) <= pcVar32) {
          if (pcVar26 < (char *)0xf) {
            *dst = (char)pcVar26 << 4;
          }
          else {
            pcVar32 = pcVar26 + -0xf;
            *dst = -0x10;
            psVar27 = (short *)((long)dst + 1);
            if ((char *)0xfe < pcVar32) {
              uVar7 = (ulong)(pcVar26 + -0x10e) / 0xff;
              memset(psVar27,0xff,uVar7 + 1);
              pcVar32 = pcVar26 + uVar7 * -0xff + -0x10e;
              psVar27 = (short *)((long)dst + uVar7 + 2);
            }
            *(char *)psVar27 = (char)pcVar32;
            dst = (char *)psVar27;
          }
          memcpy((char *)((long)dst + 1),piVar37,(size_t)pcVar26);
          return ((int)(char *)((long)dst + 1) + (int)pcVar26) - local_68;
        }
        return 0;
      }
      lVar36 = (long)src - (ulong)uVar5;
      piVar22 = (int *)(src + (long)srcSize + -0xb);
      *(short *)((long)state + (ulong)((uint)(*(int *)src * -0x61c8864f) >> 0x13) * 2) =
           (short)uVar5;
      piVar17 = (int *)(src + 2);
      puVar1 = (ulong *)(src + (long)srcSize + -0xc);
LAB_00104e30:
      iVar10 = *(int *)((long)piVar37 + 1);
      piVar9 = (int *)((long)piVar37 + 1);
      iVar23 = acceleration << 6;
      while( true ) {
        uVar7 = (ulong)((uint)(iVar10 * -0x61c8864f) >> 0x13);
        uVar19 = *(ushort *)((long)state + uVar7 * 2);
        sVar2 = (short)lVar36;
        iVar10 = *piVar17;
        *(short *)((long)state + uVar7 * 2) = (short)piVar9 - sVar2;
        if ((uVar5 <= uVar19) && (*(int *)(lVar36 + (ulong)uVar19) == *piVar9)) break;
        piVar13 = (int *)((long)(iVar23 >> 6) + (long)piVar17);
        iVar23 = iVar23 + 1;
        piVar9 = piVar17;
        piVar17 = piVar13;
        if (piVar22 < piVar13) goto LAB_0010566f;
      }
      lVar14 = (ulong)uVar19 + lVar36;
      uVar16 = (int)piVar9 - (int)piVar37;
      lVar35 = 0;
      uVar15 = uVar16 - 0xf;
      cVar4 = (char)piVar9 * '\x10' + (char)piVar37 * -0x10;
      do {
        cVar24 = cVar4;
        uVar20 = uVar15;
        lVar30 = lVar35;
        piVar17 = (int *)(lVar14 + lVar30);
        piVar13 = (int *)((long)piVar9 + lVar30);
        if ((piVar17 <= src) || (piVar13 <= piVar37)) break;
        lVar35 = lVar30 + -1;
        uVar15 = uVar20 - 1;
        cVar4 = cVar24 + -0x10;
      } while (*(char *)((long)piVar9 + lVar30 + -1) == *(char *)(lVar14 + -1 + lVar30));
      iVar10 = (int)lVar30;
      uVar7 = (ulong)(uint)(iVar10 + ((int)piVar9 - (int)piVar37));
      if (pcVar32 < (char *)((long)dst + ((ulong)uVar16 + lVar30 & 0xffffffff) / 0xff + uVar7 + 9))
      {
        return 0;
      }
      psVar27 = (short *)((long)dst + 1);
      if ((uint)((ulong)uVar16 + lVar30) < 0xf) {
        *dst = cVar24;
      }
      else {
        uVar6 = (ulong)(uVar16 - 0xf) + lVar30;
        *dst = -0x10;
        if (0xfe < (int)uVar6) {
          uVar15 = 0x1fd;
          if (uVar20 < 0x1fd) {
            uVar15 = uVar20;
          }
          if (0x1fc < (int)uVar20) {
            uVar20 = 0x1fd;
          }
          memset(psVar27,0xff,(ulong)((((uVar16 + 0xef) - uVar15) + iVar10) / 0xff + 1));
          uVar15 = ((uVar16 + 0xef) - uVar20) + iVar10;
          psVar27 = (short *)((long)dst + (ulong)uVar15 / 0xff + 2);
          uVar6 = (ulong)((uVar16 - 0x10e) + iVar10 + (uVar15 % 0xff - uVar15));
        }
        *(char *)psVar27 = (char)uVar6;
        psVar27 = (short *)((long)psVar27 + 1);
      }
      psVar31 = (short *)(uVar7 + (long)psVar27);
      do {
        *(undefined8 *)psVar27 = *(undefined8 *)piVar37;
        psVar27 = psVar27 + 4;
        piVar37 = piVar37 + 2;
      } while (psVar27 < psVar31);
      do {
        *psVar31 = (short)piVar13 - (short)piVar17;
        puVar21 = (ulong *)(piVar13 + 1);
        puVar18 = (ulong *)(piVar17 + 1);
        puVar34 = puVar21;
        if (puVar21 < puVar1) {
          if (*puVar18 == *puVar21) {
            puVar18 = (ulong *)(piVar17 + 3);
            puVar34 = (ulong *)(piVar13 + 3);
            goto LAB_00105036;
          }
          uVar7 = *puVar21 ^ *puVar18;
          lVar35 = 0;
          if (uVar7 != 0) {
            for (; (uVar7 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
            }
          }
          uVar15 = (uint)lVar35 >> 3;
        }
        else {
LAB_00105036:
          if (puVar34 < puVar1) {
            iVar10 = ((int)puVar34 - (int)piVar13) + -4;
LAB_00105044:
            if (*puVar18 == *puVar34) goto code_r0x00105050;
            uVar6 = *puVar34 ^ *puVar18;
            uVar7 = 0;
            if (uVar6 != 0) {
              for (; (uVar6 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
              }
            }
            uVar15 = ((uint)(uVar7 >> 3) & 0x1fffffff) + iVar10;
            goto LAB_001050c9;
          }
LAB_00105060:
          if ((puVar34 < src + (long)srcSize + -8) && ((int)*puVar18 == (int)*puVar34)) {
            puVar34 = (ulong *)((long)puVar34 + 4);
            puVar18 = (ulong *)((long)puVar18 + 4);
          }
          if ((puVar34 < src + (long)srcSize + -6) && ((short)*puVar18 == (short)*puVar34)) {
            puVar34 = (ulong *)((long)puVar34 + 2);
            puVar18 = (ulong *)((long)puVar18 + 2);
          }
          if (puVar34 < src + (long)srcSize + -5) {
            puVar34 = (ulong *)((long)puVar34 + (ulong)((char)*puVar18 == (char)*puVar34));
          }
          uVar15 = (int)puVar34 - (int)puVar21;
        }
LAB_001050c9:
        if (pcVar32 < (char *)((long)psVar31 + (ulong)(uVar15 + 0xf0) / 0xff + 8)) {
          return 0;
        }
        psVar27 = psVar31 + 1;
        if (uVar15 < 0xf) {
          *dst = (char)*(short *)dst + (char)uVar15;
          dst = (char *)psVar27;
        }
        else {
          *dst = (char)*(short *)dst + '\x0f';
          uVar19 = (ushort)(uVar15 - 0xf);
          psVar27[0] = -1;
          psVar27[1] = -1;
          if (0x3fb < uVar15 - 0xf) {
            uVar19 = (ushort)((ulong)(uVar15 - 0x40b) % 0x3fc);
            uVar7 = (ulong)((uVar15 - 0x40b) / 0x3fc << 2);
            memset(psVar31 + 3,0xff,uVar7 + 4);
            psVar27 = (short *)((long)psVar31 + uVar7 + 6);
          }
          pcVar26 = (char *)((long)psVar27 + (ulong)(uVar19 / 0xff));
          *pcVar26 = (char)((uint)uVar19 % 0xff);
          dst = pcVar26 + 1;
        }
        lVar35 = (long)piVar13 + (ulong)uVar15;
        piVar37 = (int *)(lVar35 + 4);
        if (piVar22 <= piVar37) goto LAB_0010566f;
        *(short *)((long)state + (ulong)((uint)(*(int *)(lVar35 + 2) * -0x61c8864f) >> 0x13) * 2) =
             ((short)lVar35 + 2) - sVar2;
        uVar7 = (ulong)((uint)(*piVar37 * -0x61c8864f) >> 0x13);
        uVar19 = *(ushort *)((long)state + uVar7 * 2);
        *(short *)((long)state + uVar7 * 2) = (short)piVar37 - sVar2;
        if ((uVar19 < uVar5) || (piVar17 = (int *)((ulong)uVar19 + lVar36), *piVar17 != *piVar37))
        goto LAB_001051e3;
        psVar31 = (short *)((long)dst + 1);
        *dst = '\0';
        piVar13 = piVar37;
      } while( true );
    }
  }
  else {
    memset(state,0,0x4020);
  }
LAB_00103912:
  if (0x7e000000 < (uint)srcSize) {
    return 0;
  }
  pcVar32 = dst + dstCapacity;
  *(int *)((long)state + 0x4018) = srcSize;
  *(int *)((long)state + 0x4000) = srcSize;
  *(undefined2 *)((long)state + 0x4006) = 3;
  local_88 = (short *)dst;
  piVar37 = (int *)src;
  if (0xc < (uint)srcSize) {
    *(undefined2 *)((long)state + (ulong)((uint)(*(int *)src * -0x61c8864f) >> 0x13) * 2) = 0;
    puVar1 = (ulong *)(src + (long)srcSize + -0xc);
LAB_001039b2:
    iVar25 = 1;
    iVar10 = *(int *)((long)piVar37 + 1);
    piVar17 = (int *)((long)piVar37 + 1);
    iVar23 = acceleration << 6;
    do {
      piVar22 = piVar17;
      piVar17 = (int *)((long)iVar25 + (long)piVar22);
      if (src + (long)srcSize + -0xb < piVar17) goto LAB_00103d65;
      iVar25 = iVar23 >> 6;
      iVar23 = iVar23 + 1;
      uVar6 = (ulong)((uint)(iVar10 * -0x61c8864f) >> 0x13);
      uVar7 = (ulong)*(ushort *)((long)state + uVar6 * 2);
      iVar10 = *piVar17;
      *(short *)((long)state + uVar6 * 2) = (short)piVar22 - sVar3;
    } while (*(int *)(src + uVar7) != *piVar22);
    uVar15 = (int)piVar22 - (int)piVar37;
    lVar36 = 0;
    uVar5 = uVar15 - 0xf;
    cVar4 = (char)piVar22 * '\x10' + (char)piVar37 * -0x10;
    do {
      cVar24 = cVar4;
      uVar16 = uVar5;
      lVar35 = lVar36;
      pcVar26 = src + lVar35 + uVar7;
      piVar17 = (int *)((long)piVar22 + lVar35);
      if ((pcVar26 <= src) || (piVar17 <= piVar37)) break;
      lVar36 = lVar35 + -1;
      uVar5 = uVar16 - 1;
      cVar4 = cVar24 + -0x10;
    } while (*(char *)((long)piVar22 + lVar35 + -1) == src[lVar35 + (uVar7 - 1)]);
    iVar10 = (int)lVar35;
    uVar7 = (ulong)(uint)(iVar10 + ((int)piVar22 - (int)piVar37));
    if (pcVar32 < (char *)((long)local_88 + ((ulong)uVar15 + lVar35 & 0xffffffff) / 0xff + uVar7 + 9
                          )) {
      return 0;
    }
    psVar27 = (short *)((long)local_88 + 1);
    if ((uint)((ulong)uVar15 + lVar35) < 0xf) {
      *(char *)local_88 = cVar24;
    }
    else {
      uVar6 = (ulong)(uVar15 - 0xf) + lVar35;
      *(char *)local_88 = -0x10;
      if (0xfe < (int)uVar6) {
        uVar5 = 0x1fd;
        if (uVar16 < 0x1fd) {
          uVar5 = uVar16;
        }
        if (0x1fc < (int)uVar16) {
          uVar16 = 0x1fd;
        }
        memset(psVar27,0xff,(ulong)((((uVar15 + 0xef) - uVar5) + iVar10) / 0xff + 1));
        uVar5 = ((uVar15 + 0xef) - uVar16) + iVar10;
        psVar27 = (short *)((long)local_88 + (ulong)uVar5 / 0xff + 2);
        uVar6 = (ulong)((uVar15 - 0x10e) + iVar10 + (uVar5 % 0xff - uVar5));
      }
      *(char *)psVar27 = (char)uVar6;
      psVar27 = (short *)((long)psVar27 + 1);
    }
    psVar31 = (short *)(uVar7 + (long)psVar27);
    do {
      *(undefined8 *)psVar27 = *(undefined8 *)piVar37;
      psVar27 = psVar27 + 4;
      piVar37 = piVar37 + 2;
      psVar33 = local_88;
    } while (psVar27 < psVar31);
    do {
      *psVar31 = (short)piVar17 - (short)pcVar26;
      puVar18 = (ulong *)(piVar17 + 1);
      puVar21 = (ulong *)(pcVar26 + 4);
      puVar34 = puVar18;
      if (puVar18 < puVar1) {
        if (*puVar21 == *puVar18) {
          puVar21 = (ulong *)(pcVar26 + 0xc);
          puVar34 = (ulong *)(piVar17 + 3);
          goto LAB_00103bb1;
        }
        uVar7 = *puVar18 ^ *puVar21;
        lVar36 = 0;
        if (uVar7 != 0) {
          for (; (uVar7 >> lVar36 & 1) == 0; lVar36 = lVar36 + 1) {
          }
        }
        uVar5 = (uint)lVar36 >> 3;
      }
      else {
LAB_00103bb1:
        if (puVar34 < puVar1) {
          iVar10 = ((int)puVar34 - (int)piVar17) + -4;
LAB_00103bbf:
          if (*puVar21 == *puVar34) goto code_r0x00103bcb;
          uVar6 = *puVar34 ^ *puVar21;
          uVar7 = 0;
          if (uVar6 != 0) {
            for (; (uVar6 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
            }
          }
          uVar5 = ((uint)(uVar7 >> 3) & 0x1fffffff) + iVar10;
          goto LAB_00103c40;
        }
LAB_00103bdb:
        if ((puVar34 < src + (long)srcSize + -8) && ((int)*puVar21 == (int)*puVar34)) {
          puVar34 = (ulong *)((long)puVar34 + 4);
          puVar21 = (ulong *)((long)puVar21 + 4);
        }
        if ((puVar34 < src + (long)srcSize + -6) && ((short)*puVar21 == (short)*puVar34)) {
          puVar34 = (ulong *)((long)puVar34 + 2);
          puVar21 = (ulong *)((long)puVar21 + 2);
        }
        if (puVar34 < src + (long)srcSize + -5) {
          puVar34 = (ulong *)((long)puVar34 + (ulong)((char)*puVar21 == (char)*puVar34));
        }
        uVar5 = (int)puVar34 - (int)puVar18;
      }
LAB_00103c40:
      if (pcVar32 < (char *)((long)psVar31 + (ulong)(uVar5 + 0xf0) / 0xff + 8)) {
        return 0;
      }
      local_88 = psVar31 + 1;
      if (uVar5 < 0xf) {
        *(char *)psVar33 = (char)*psVar33 + (char)uVar5;
      }
      else {
        *(char *)psVar33 = (char)*psVar33 + '\x0f';
        uVar19 = (ushort)(uVar5 - 0xf);
        local_88[0] = -1;
        local_88[1] = -1;
        if (0x3fb < uVar5 - 0xf) {
          uVar19 = (ushort)((ulong)(uVar5 - 0x40b) % 0x3fc);
          uVar7 = (ulong)((uVar5 - 0x40b) / 0x3fc << 2);
          memset(psVar31 + 3,0xff,uVar7 + 4);
          local_88 = (short *)((long)psVar31 + uVar7 + 6);
        }
        pcVar26 = (char *)((long)local_88 + (ulong)(uVar19 / 0xff));
        local_88 = (short *)(pcVar26 + 1);
        *pcVar26 = (char)((uint)uVar19 % 0xff);
      }
      lVar36 = (long)piVar17 + (ulong)uVar5;
      piVar37 = (int *)(lVar36 + 4);
      if (src + (long)srcSize + -0xb <= piVar37) break;
      *(short *)((long)state + (ulong)((uint)(*(int *)(lVar36 + 2) * -0x61c8864f) >> 0x13) * 2) =
           ((short)lVar36 + 2) - sVar3;
      uVar7 = (ulong)((uint)(*piVar37 * -0x61c8864f) >> 0x13);
      uVar19 = *(ushort *)((long)state + uVar7 * 2);
      pcVar26 = src + uVar19;
      *(short *)((long)state + uVar7 * 2) = (short)piVar37 - sVar3;
      if (*(int *)(src + uVar19) != *piVar37) goto LAB_001039b2;
      psVar31 = (short *)((long)local_88 + 1);
      *(char *)local_88 = '\0';
      psVar33 = local_88;
      piVar17 = piVar37;
    } while( true );
  }
LAB_00103d65:
  pcVar26 = src + ((long)srcSize - (long)piVar37);
  if (pcVar32 < (char *)((long)local_88 + (long)(pcVar26 + (ulong)(pcVar26 + 0xf0) / 0xff + 1))) {
    return 0;
  }
  if (pcVar26 < (char *)0xf) {
    *(char *)local_88 = (char)pcVar26 << 4;
  }
  else {
    pcVar32 = pcVar26 + -0xf;
    *(char *)local_88 = -0x10;
    psVar27 = (short *)((long)local_88 + 1);
    if ((char *)0xfe < pcVar32) {
      uVar7 = (ulong)(pcVar26 + -0x10e) / 0xff;
      memset(psVar27,0xff,uVar7 + 1);
      pcVar32 = pcVar26 + uVar7 * -0xff + -0x10e;
      psVar27 = (short *)((long)local_88 + uVar7 + 2);
    }
    *(char *)psVar27 = (char)pcVar32;
    local_88 = psVar27;
  }
  memcpy((char *)((long)local_88 + 1),piVar37,(size_t)pcVar26);
  iVar10 = (int)(char *)((long)local_88 + 1) + (int)pcVar26;
LAB_00104da4:
  return iVar10 - local_68;
code_r0x00104ade:
  puVar18 = puVar18 + 1;
  puVar21 = puVar21 + 1;
  goto LAB_00104aca;
LAB_00104c4a:
  plVar11 = (long *)((long)plVar38 + 2);
  if (plVar8 < plVar11) goto LAB_00104c62;
  goto LAB_001048ed;
LAB_00104c62:
  pcVar32 = src + ((ulong)(uint)srcSize - (long)plVar38);
  if (pcVar32 < (char *)0xf) {
    *dst = (char)pcVar32 << 4;
  }
  else {
    pcVar26 = pcVar32 + -0xf;
    *dst = -0x10;
    pcVar29 = dst + 1;
    if ((char *)0xfe < pcVar26) {
      uVar7 = (ulong)(pcVar32 + -0x10e) / 0xff;
      memset(pcVar29,0xff,uVar7 + 1);
      pcVar26 = pcVar32 + uVar7 * -0xff + -0x10e;
      pcVar29 = dst + uVar7 + 2;
    }
    *pcVar29 = (char)pcVar26;
    dst = pcVar29;
  }
  memcpy(dst + 1,plVar38,(size_t)pcVar32);
  iVar10 = (int)(dst + 1) + (int)pcVar32;
  goto LAB_00104ce4;
code_r0x00105465:
  puVar18 = puVar18 + 1;
  puVar21 = puVar21 + 1;
  goto LAB_00105451;
LAB_001055c8:
  piVar17 = (int *)((long)piVar37 + 2);
  if (piVar22 < piVar17) goto LAB_001055e2;
  goto LAB_00105275;
code_r0x00104185:
  puVar18 = puVar18 + 1;
  puVar21 = puVar21 + 1;
  goto LAB_00104171;
code_r0x00104686:
  puVar34 = puVar34 + 1;
  puVar21 = puVar21 + 1;
  iVar10 = iVar10 + 8;
  if (puVar1 <= puVar34) goto LAB_00104696;
  goto LAB_0010467a;
LAB_0010481f:
  plVar11 = (long *)(lVar35 + 6);
  if (plVar8 < plVar11) goto LAB_00104cf6;
  goto LAB_00104463;
LAB_00104cf6:
  pcVar26 = src + ((ulong)(uint)srcSize - (long)plVar38);
  if (pcVar32 < dst + (long)(pcVar26 + (ulong)(pcVar26 + 0xf0) / 0xff + 1)) {
    return 0;
  }
  if (pcVar26 < (char *)0xf) {
    *dst = (char)pcVar26 << 4;
  }
  else {
    pcVar32 = pcVar26 + -0xf;
    *dst = -0x10;
    pcVar29 = dst + 1;
    if ((char *)0xfe < pcVar32) {
      uVar7 = (ulong)(pcVar26 + -0x10e) / 0xff;
      memset(pcVar29,0xff,uVar7 + 1);
      pcVar32 = pcVar26 + uVar7 * -0xff + -0x10e;
      pcVar29 = dst + uVar7 + 2;
    }
    *pcVar29 = (char)pcVar32;
    dst = pcVar29;
  }
  memcpy(dst + 1,plVar38,(size_t)pcVar26);
  iVar10 = (int)(dst + 1) + (int)pcVar26;
  goto LAB_00104da4;
code_r0x00105050:
  puVar34 = puVar34 + 1;
  puVar18 = puVar18 + 1;
  iVar10 = iVar10 + 8;
  if (puVar1 <= puVar34) goto LAB_00105060;
  goto LAB_00105044;
LAB_001051e3:
  piVar17 = (int *)(lVar35 + 6);
  if (piVar22 < piVar17) goto LAB_0010566f;
  goto LAB_00104e30;
code_r0x00103bcb:
  puVar34 = puVar34 + 1;
  puVar21 = puVar21 + 1;
  iVar10 = iVar10 + 8;
  if (puVar1 <= puVar34) goto LAB_00103bdb;
  goto LAB_00103bbf;
}

Assistant:

int LZ4_compress_fast_extState_fastReset(void* state, const char* src, char* dst, int srcSize, int dstCapacity, int acceleration)
{
    LZ4_stream_t_internal* ctx = &((LZ4_stream_t*)state)->internal_donotuse;
    if (acceleration < 1) acceleration = ACCELERATION_DEFAULT;

    if (dstCapacity >= LZ4_compressBound(srcSize)) {
        if (srcSize < LZ4_64Klimit) {
            const tableType_t tableType = byU16;
            LZ4_prepareTable(ctx, srcSize, tableType);
            if (ctx->currentOffset) {
                return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, 0, notLimited, tableType, noDict, dictSmall, acceleration);
            } else {
                return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, 0, notLimited, tableType, noDict, noDictIssue, acceleration);
            }
        } else {
            const tableType_t tableType = ((sizeof(void*)==4) && ((uptrval)src > LZ4_DISTANCE_MAX)) ? byPtr : byU32;
            LZ4_prepareTable(ctx, srcSize, tableType);
            return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, 0, notLimited, tableType, noDict, noDictIssue, acceleration);
        }
    } else {
        if (srcSize < LZ4_64Klimit) {
            const tableType_t tableType = byU16;
            LZ4_prepareTable(ctx, srcSize, tableType);
            if (ctx->currentOffset) {
                return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, dstCapacity, limitedOutput, tableType, noDict, dictSmall, acceleration);
            } else {
                return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, dstCapacity, limitedOutput, tableType, noDict, noDictIssue, acceleration);
            }
        } else {
            const tableType_t tableType = ((sizeof(void*)==4) && ((uptrval)src > LZ4_DISTANCE_MAX)) ? byPtr : byU32;
            LZ4_prepareTable(ctx, srcSize, tableType);
            return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, dstCapacity, limitedOutput, tableType, noDict, noDictIssue, acceleration);
        }
    }
}